

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O2

bool __thiscall cppnet::RWSocket::Send(RWSocket *this)

{
  element_type *peVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  SysCallInt32Result SVar5;
  int *piVar6;
  uint32_t len;
  byte bVar7;
  __shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> io_vec;
  shared_ptr<cppnet::EventActions> actions;
  shared_ptr<cppnet::CppNetBase> cppnet_base;
  _Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> local_78;
  shared_ptr<cppnet::RWSocket> local_60;
  __shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  p_Var8 = &local_40;
  std::__shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (p_Var8,&(this->super_Socket)._cppnet_base);
  len = 0;
  if (local_40._M_ptr == (CppNetBase *)0x0) {
    bVar7 = 0;
  }
  else {
    do {
      peVar1 = (this->_write_buffer).
               super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar1 == (element_type *)0x0) ||
         (iVar3 = (*(peVar1->super_InnerBuffer).super_Buffer._vptr_Buffer[8])(), iVar3 == 0)) {
        std::__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<cppnet::RWSocket,void>
                  ((__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2> *)&local_60,
                   (__weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<cppnet::RWSocket>);
        CppNetBase::OnWrite(local_40._M_ptr,&local_60,len);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_60.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        bVar7 = 1;
        break;
      }
      local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_start = (Iovec *)0x0;
      local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      peVar1 = (this->_write_buffer).
               super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*(peVar1->super_InnerBuffer).super_Buffer._vptr_Buffer[0x11])(peVar1,&local_78,0x1000);
      SVar5 = OsHandle::Writev((this->super_Socket)._sock,
                               local_78._M_impl.super__Vector_impl_data._M_start,
                               (uint32_t)
                               ((ulong)((long)local_78._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_78._M_impl.super__Vector_impl_data._M_start) >> 4
                               ));
      if ((ulong)SVar5 < 0x80000000) {
        peVar1 = (this->_write_buffer).
                 super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*(peVar1->super_InnerBuffer).super_Buffer._vptr_Buffer[6])
                  (peVar1,(ulong)SVar5 & 0xffffffff);
        len = len + SVar5._return_value;
      }
      else {
        piVar6 = __errno_location();
        iVar3 = *piVar6;
        if (iVar3 == 4) {
LAB_0010c851:
          std::__shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_50,&(this->super_Socket)._event_actions);
          if (local_50._M_ptr == (element_type *)0x0) {
            p_Var8 = (__shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            uVar4 = (*(local_50._M_ptr)->_vptr_EventActions[4])(local_50._M_ptr,this->_event);
            p_Var8 = (__shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar4;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
        }
        else {
          if (iVar3 == 0x4a) {
            uVar2 = 2;
          }
          else {
            if (iVar3 == 0xb) goto LAB_0010c851;
            uVar2 = 1;
          }
          (*(this->super_Socket)._vptr_Socket[0x11])(this,(ulong)uVar2);
          p_Var8 = (__shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
      }
      bVar7 = (byte)p_Var8;
      std::_Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::~_Vector_base(&local_78);
    } while ((ulong)SVar5 >> 0x1f == 0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return (bool)(bVar7 & 1);
}

Assistant:

bool RWSocket::Send() {
    auto cppnet_base = _cppnet_base.lock();
    if (!cppnet_base) {
        return false;
    }

    uint32_t off_set = 0;
    while(_write_buffer && _write_buffer->GetCanReadLength() > 0) {
        std::vector<Iovec> io_vec;
        _write_buffer->GetUseMemoryBlock(io_vec, __linux_write_buff_get);
        auto ret = OsHandle::Writev(_sock, &*io_vec.begin(), io_vec.size());
        if (ret._return_value >= 0 && ret._errno == 0) {
            _write_buffer->MoveReadPt(ret._return_value);
            off_set += ret._return_value;

        } else {
            if (errno == EWOULDBLOCK || errno == EAGAIN || errno == EINTR) {
                //can't send complete
                auto actions = GetEventActions();
                if (actions) {
                    return actions->AddSendEvent(_event);
                }
                return false;

            } else if (errno == EBADMSG) {
                OnDisConnect(CEC_CONNECT_BREAK);
                return false;

            } else {
                OnDisConnect(CEC_CLOSED);
                return false;
            }
        }
    }
    cppnet_base->OnWrite(shared_from_this(), off_set);
    return true;
}